

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  float *pfVar2;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImRect local_34;
  ImGuiNavLayer local_24;
  ImGuiContext *pIStack_20;
  ImGuiNavLayer nav_layer;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  pIStack_20 = GImGui;
  g = (ImGuiContext *)window;
  window_local._4_4_ = id;
  if (id != 0) {
    local_24 = (window->DC).NavLayerCurrent;
    if (GImGui->NavWindow != window) {
      GImGui->NavInitRequest = false;
    }
    pIVar1->NavWindow = window;
    pIVar1->NavId = id;
    pIVar1->NavLayer = local_24;
    pIVar1->NavFocusScopeId = (window->DC).NavFocusScopeIdCurrent;
    window->NavLastIds[local_24] = id;
    if ((pIVar1->LastItemData).ID == id) {
      local_3c = operator-(&(pIVar1->LastItemData).NavRect.Min,&window->Pos);
      local_44 = operator-(&(pIStack_20->LastItemData).NavRect.Max,(ImVec2 *)((g->IO).KeyMap + 3));
      ImRect::ImRect(&local_34,&local_3c,&local_44);
      pfVar2 = &(g->IO).MouseClickedPos[(ulong)local_24 * 2 + -3].y;
      *(ImVec2 *)pfVar2 = local_34.Min;
      *(ImVec2 *)(pfVar2 + 2) = local_34.Max;
    }
    if (pIStack_20->ActiveIdSource == ImGuiInputSource_Nav) {
      pIStack_20->NavDisableMouseHover = true;
    }
    else {
      pIStack_20->NavDisableHighlight = true;
    }
    return;
  }
  __assert_fail("id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x24e6,"void ImGui::SetFocusID(ImGuiID, ImGuiWindow *)");
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and window->DC.NavFocusScopeIdCurrent are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    if (g.NavWindow != window)
        g.NavInitRequest = false;
    g.NavWindow = window;
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
    window->NavLastIds[nav_layer] = id;
    if (g.LastItemData.ID == id)
        window->NavRectRel[nav_layer] = ImRect(g.LastItemData.NavRect.Min - window->Pos, g.LastItemData.NavRect.Max - window->Pos);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}